

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::PrintToFloatingPoint<double>(floating_point<double> *f,iu_ostream *os)

{
  ulong uVar1;
  char cVar2;
  char cVar10;
  short sVar18;
  undefined1 auVar19 [12];
  ostream *poVar20;
  size_t sVar21;
  uint uVar22;
  uint uVar23;
  uint uVar25;
  undefined8 extraout_XMM0_Qb;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  undefined1 auVar29 [16];
  uint uVar31;
  uint uVar33;
  short sVar34;
  undefined1 auVar40 [16];
  short sVar42;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  iu_stringstream ss;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  char local_1b8 [4];
  char cStack_1b4;
  char cStack_1b3;
  char cStack_1b2;
  char cStack_1b1;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  char cStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  char cStack_1a9;
  undefined1 local_1a8;
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined1 auVar24 [16];
  uint uVar30;
  undefined1 auVar32 [16];
  undefined4 uVar35;
  undefined6 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [14];
  undefined1 auVar41 [16];
  undefined4 uVar43;
  undefined6 uVar44;
  undefined8 uVar45;
  undefined1 auVar46 [12];
  undefined1 auVar47 [14];
  undefined1 auVar50 [16];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x11;
  std::ostream::_M_insert<double>((f->m_v).fv);
  std::__cxx11::stringbuf::str();
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,"(0x",3);
  uVar1 = (f->m_v).uv;
  uVar25 = (uint)(uVar1 >> 0x20);
  auVar19._4_8_ = extraout_XMM0_Qb;
  auVar19._0_4_ = uVar25;
  auVar49._0_8_ = auVar19._0_8_ << 0x20;
  auVar49._8_4_ = (uint)uVar1;
  auVar49._12_4_ = uVar25;
  uVar28 = uVar25 >> 0x1c;
  uVar23 = (uint)(uVar1 >> 0xc);
  uVar22 = (uint)(uVar1 >> 0x1c);
  uVar26 = uVar25 >> 0xc & 0xf;
  uVar27 = uVar25 >> 8 & 0xf;
  auVar55._0_8_ = CONCAT44(uVar25 >> 8,uVar25 >> 0xc) & 0xf0000000f;
  auVar55._8_4_ = uVar25 >> 4 & 0xf;
  auVar55._12_4_ = uVar25 & 0xf;
  uVar30 = uVar25 >> 0x18 & 0xf;
  auVar29._0_8_ = CONCAT44(uVar25 >> 0x18,uVar28) & 0xf0000000f;
  auVar29._8_4_ = uVar25 >> 0x14 & 0xf;
  auVar29._12_4_ = uVar25 >> 0x10 & 0xf;
  uVar31 = uVar23 & 0xf;
  uVar33 = auVar49._9_4_ & 0xf;
  auVar32._0_8_ = CONCAT44(auVar49._9_4_,uVar23) & 0xf0000000f;
  auVar32._8_4_ = (uint)(uVar1 >> 4) & 0xf;
  auVar32._12_4_ = (uint)uVar1 & 0xf;
  uVar23 = uVar22 & 0xf;
  uVar25 = auVar49._11_4_ & 0xf;
  auVar24._0_8_ = CONCAT44(auVar49._11_4_,uVar22) & 0xf0000000f;
  auVar24._8_4_ = (uint)(uVar1 >> 0x14) & 0xf;
  auVar24._12_4_ = auVar49._10_4_ & 0xf;
  auVar40._0_4_ = -(uint)(9 < uVar23);
  auVar40._4_4_ = -(uint)(9 < uVar25);
  auVar40._8_4_ = -(uint)(9 < auVar24._8_4_);
  auVar40._12_4_ = -(uint)(9 < auVar24._12_4_);
  auVar51._0_4_ = -(uint)(9 < uVar31);
  auVar51._4_4_ = -(uint)(9 < uVar33);
  auVar51._8_4_ = -(uint)(9 < auVar32._8_4_);
  auVar51._12_4_ = -(uint)(9 < auVar32._12_4_);
  auVar48._0_4_ = -(uint)(9 < uVar28);
  auVar48._4_4_ = -(uint)(9 < uVar30);
  auVar48._8_4_ = -(uint)(9 < auVar29._8_4_);
  auVar48._12_4_ = -(uint)(9 < auVar29._12_4_);
  auVar54._0_4_ = -(uint)(9 < uVar26);
  auVar54._4_4_ = -(uint)(9 < uVar27);
  auVar54._8_4_ = -(uint)(9 < auVar55._8_4_);
  auVar54._12_4_ = -(uint)(9 < auVar55._12_4_);
  auVar52._0_4_ = uVar23 + 0x37;
  auVar52._4_4_ = uVar25 + 0x37;
  auVar52._8_4_ = auVar24._8_4_ + 0x37;
  auVar52._12_4_ = auVar24._12_4_ + 0x37;
  auVar53._0_4_ = uVar31 + 0x37;
  auVar53._4_4_ = uVar33 + 0x37;
  auVar53._8_4_ = auVar32._8_4_ + 0x37;
  auVar53._12_4_ = auVar32._12_4_ + 0x37;
  auVar57._0_4_ = uVar28 + 0x37;
  auVar57._4_4_ = uVar30 + 0x37;
  auVar57._8_4_ = auVar29._8_4_ + 0x37;
  auVar57._12_4_ = auVar29._12_4_ + 0x37;
  auVar56._0_4_ = uVar26 + 0x37;
  auVar56._4_4_ = uVar27 + 0x37;
  auVar56._8_4_ = auVar55._8_4_ + 0x37;
  auVar56._12_4_ = auVar55._12_4_ + 0x37;
  auVar55 = ~auVar54 & (auVar55 | _DAT_00325080) | auVar56 & auVar54;
  auVar49 = ~auVar48 & (auVar29 | _DAT_00325080) | auVar57 & auVar48;
  sVar18 = auVar49._0_2_;
  cVar2 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[0] - (0xff < sVar18);
  sVar18 = auVar49._2_2_;
  sVar42 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * auVar49[2] - (0xff < sVar18),cVar2);
  sVar18 = auVar49._4_2_;
  cVar3 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[4] - (0xff < sVar18);
  sVar18 = auVar49._6_2_;
  uVar43 = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar49[6] - (0xff < sVar18),
                    CONCAT12(cVar3,sVar42));
  sVar18 = auVar49._8_2_;
  cVar4 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[8] - (0xff < sVar18);
  sVar18 = auVar49._10_2_;
  uVar44 = CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar49[10] - (0xff < sVar18),
                    CONCAT14(cVar4,uVar43));
  sVar18 = auVar49._12_2_;
  cVar5 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[0xc] - (0xff < sVar18);
  sVar18 = auVar49._14_2_;
  uVar45 = CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar49[0xe] - (0xff < sVar18),
                    CONCAT16(cVar5,uVar44));
  sVar18 = auVar55._0_2_;
  cVar6 = (0 < sVar18) * (sVar18 < 0x100) * auVar55[0] - (0xff < sVar18);
  sVar18 = auVar55._2_2_;
  auVar46._0_10_ =
       CONCAT19((0 < sVar18) * (sVar18 < 0x100) * auVar55[2] - (0xff < sVar18),
                CONCAT18(cVar6,uVar45));
  sVar18 = auVar55._4_2_;
  cVar7 = (0 < sVar18) * (sVar18 < 0x100) * auVar55[4] - (0xff < sVar18);
  auVar46[10] = cVar7;
  sVar18 = auVar55._6_2_;
  auVar46[0xb] = (0 < sVar18) * (sVar18 < 0x100) * auVar55[6] - (0xff < sVar18);
  sVar18 = auVar55._8_2_;
  cVar8 = (0 < sVar18) * (sVar18 < 0x100) * auVar55[8] - (0xff < sVar18);
  auVar47[0xc] = cVar8;
  auVar47._0_12_ = auVar46;
  sVar18 = auVar55._10_2_;
  auVar47[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar55[10] - (0xff < sVar18);
  sVar18 = auVar55._12_2_;
  cVar9 = (0 < sVar18) * (sVar18 < 0x100) * auVar55[0xc] - (0xff < sVar18);
  auVar50[0xe] = cVar9;
  auVar50._0_14_ = auVar47;
  sVar18 = auVar55._14_2_;
  auVar50[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar55[0xe] - (0xff < sVar18);
  auVar55 = ~auVar51 & (auVar32 | _DAT_00325080) | auVar53 & auVar51;
  auVar49 = ~auVar40 & (auVar24 | _DAT_00325080) | auVar52 & auVar40;
  sVar18 = auVar49._0_2_;
  cVar10 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[0] - (0xff < sVar18);
  sVar18 = auVar49._2_2_;
  sVar34 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * auVar49[2] - (0xff < sVar18),cVar10);
  sVar18 = auVar49._4_2_;
  cVar11 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[4] - (0xff < sVar18);
  sVar18 = auVar49._6_2_;
  uVar35 = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar49[6] - (0xff < sVar18),
                    CONCAT12(cVar11,sVar34));
  sVar18 = auVar49._8_2_;
  cVar12 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[8] - (0xff < sVar18);
  sVar18 = auVar49._10_2_;
  uVar36 = CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar49[10] - (0xff < sVar18),
                    CONCAT14(cVar12,uVar35));
  sVar18 = auVar49._12_2_;
  cVar13 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[0xc] - (0xff < sVar18);
  sVar18 = auVar49._14_2_;
  uVar37 = CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar49[0xe] - (0xff < sVar18),
                    CONCAT16(cVar13,uVar36));
  sVar18 = auVar55._0_2_;
  cVar14 = (0 < sVar18) * (sVar18 < 0x100) * auVar55[0] - (0xff < sVar18);
  sVar18 = auVar55._2_2_;
  auVar38._0_10_ =
       CONCAT19((0 < sVar18) * (sVar18 < 0x100) * auVar55[2] - (0xff < sVar18),
                CONCAT18(cVar14,uVar37));
  sVar18 = auVar55._4_2_;
  cVar15 = (0 < sVar18) * (sVar18 < 0x100) * auVar55[4] - (0xff < sVar18);
  auVar38[10] = cVar15;
  sVar18 = auVar55._6_2_;
  auVar38[0xb] = (0 < sVar18) * (sVar18 < 0x100) * auVar55[6] - (0xff < sVar18);
  sVar18 = auVar55._8_2_;
  cVar16 = (0 < sVar18) * (sVar18 < 0x100) * auVar55[8] - (0xff < sVar18);
  auVar39[0xc] = cVar16;
  auVar39._0_12_ = auVar38;
  sVar18 = auVar55._10_2_;
  auVar39[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar55[10] - (0xff < sVar18);
  sVar18 = auVar55._12_2_;
  cVar17 = (0 < sVar18) * (sVar18 < 0x100) * auVar55[0xc] - (0xff < sVar18);
  auVar41[0xe] = cVar17;
  auVar41._0_14_ = auVar39;
  sVar18 = auVar55._14_2_;
  auVar41[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar55[0xe] - (0xff < sVar18);
  local_1b8[0] = (0 < sVar42) * (sVar42 < 0x100) * cVar2 - (0xff < sVar42);
  sVar18 = (short)((uint)uVar43 >> 0x10);
  local_1b8[1] = (0 < sVar18) * (sVar18 < 0x100) * cVar3 - (0xff < sVar18);
  sVar18 = (short)((uint6)uVar44 >> 0x20);
  local_1b8[2] = (0 < sVar18) * (sVar18 < 0x100) * cVar4 - (0xff < sVar18);
  sVar18 = (short)((ulong)uVar45 >> 0x30);
  local_1b8[3] = (0 < sVar18) * (sVar18 < 0x100) * cVar5 - (0xff < sVar18);
  sVar18 = (short)((unkuint10)auVar46._0_10_ >> 0x40);
  cStack_1b4 = (0 < sVar18) * (sVar18 < 0x100) * cVar6 - (0xff < sVar18);
  sVar18 = auVar46._10_2_;
  cStack_1b3 = (0 < sVar18) * (sVar18 < 0x100) * cVar7 - (0xff < sVar18);
  sVar18 = auVar47._12_2_;
  cStack_1b2 = (0 < sVar18) * (sVar18 < 0x100) * cVar8 - (0xff < sVar18);
  sVar18 = auVar50._14_2_;
  cStack_1b1 = (0 < sVar18) * (sVar18 < 0x100) * cVar9 - (0xff < sVar18);
  cStack_1b0 = (0 < sVar34) * (sVar34 < 0x100) * cVar10 - (0xff < sVar34);
  sVar18 = (short)((uint)uVar35 >> 0x10);
  cStack_1af = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
  sVar18 = (short)((uint6)uVar36 >> 0x20);
  cStack_1ae = (0 < sVar18) * (sVar18 < 0x100) * cVar12 - (0xff < sVar18);
  sVar18 = (short)((ulong)uVar37 >> 0x30);
  cStack_1ad = (0 < sVar18) * (sVar18 < 0x100) * cVar13 - (0xff < sVar18);
  sVar18 = (short)((unkuint10)auVar38._0_10_ >> 0x40);
  cStack_1ac = (0 < sVar18) * (sVar18 < 0x100) * cVar14 - (0xff < sVar18);
  sVar18 = auVar38._10_2_;
  cStack_1ab = (0 < sVar18) * (sVar18 < 0x100) * cVar15 - (0xff < sVar18);
  sVar18 = auVar39._12_2_;
  cStack_1aa = (0 < sVar18) * (sVar18 < 0x100) * cVar16 - (0xff < sVar18);
  sVar18 = auVar41._14_2_;
  cStack_1a9 = (0 < sVar18) * (sVar18 < 0x100) * cVar17 - (0xff < sVar18);
  local_1a8 = 0;
  local_1f8 = local_1e8;
  sVar21 = strlen(local_1b8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,local_1b8,local_1b8 + sVar21)
  ;
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)local_1f8,local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,")",1);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

inline void PrintToFloatingPoint(const floating_point<T>& f, iu_ostream* os)
{
    iu_stringstream ss;
#if IUTEST_HAS_IOMANIP
    ss << ::std::setprecision(::std::numeric_limits<T>::digits10 + 2);
#endif
    UniversalPrint(f.raw(), &ss);
    *os << ss.str() << "(0x" << ToHexString(f.bits()) << ")";
}